

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.hpp
# Opt level: O0

iterator * __thiscall
unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::prior
          (iterator *this)

{
  bool bVar1;
  node_type type;
  iter_result<unodb::detail::node_header> *e_00;
  node_ptr node_00;
  iterator *piVar2;
  node_ptr child;
  iter_result<unodb::detail::node_header> *e2;
  iter_result_opt nxt;
  inode<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *inode;
  basic_node_ptr<unodb::detail::node_header> bStack_28;
  node_type node_type;
  node_ptr node;
  stack_entry *e;
  iterator *this_local;
  
  while( true ) {
    bVar1 = empty(this);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return this;
    }
    node.tagged_ptr = (uintptr_t)top(this);
    bStack_28.tagged_ptr = (((stack_entry *)node.tagged_ptr)->node).tagged_ptr;
    bVar1 = detail::basic_node_ptr<unodb::detail::node_header>::operator==
                      (&stack0xffffffffffffffd8,(nullptr_t)0x0);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    type = detail::basic_node_ptr<unodb::detail::node_header>::type(&stack0xffffffffffffffd8);
    if (type == LEAF) {
      pop(this);
    }
    else {
      nxt.super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>.
      _M_payload.
      super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>._24_8_ =
           detail::basic_node_ptr<unodb::detail::node_header>::
           ptr<unodb::detail::inode<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>*>
                     (&stack0xffffffffffffffd8);
      detail::
      basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
      ::prior((iter_result_opt *)&e2,
              (basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
               *)nxt.
                 super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
                 ._M_payload.
                 super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
                 ._24_8_,type,*(uint8_t *)(node.tagged_ptr + 9));
      bVar1 = std::optional::operator_cast_to_bool((optional *)&e2);
      if (bVar1) {
        bVar1 = std::optional<unodb::detail::iter_result<unodb::detail::node_header>_>::has_value
                          ((optional<unodb::detail::iter_result<unodb::detail::node_header>_> *)&e2)
        ;
        if (bVar1) {
          e_00 = std::optional<unodb::detail::iter_result<unodb::detail::node_header>_>::value
                           ((optional<unodb::detail::iter_result<unodb::detail::node_header>_> *)&e2
                           );
          pop(this);
          push(this,e_00);
          node_00 = detail::
                    basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                    ::get_child((basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                                 *)nxt.
                                   super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
                                   ._M_payload.
                                   super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
                                   ._24_8_,type,e_00->child_index);
          piVar2 = right_most_traversal(this,(node_ptr)node_00.tagged_ptr);
          return piVar2;
        }
        __assert_fail("nxt.has_value()",
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art.hpp"
                      ,0x462,
                      "typename db<Key, Value>::iterator &unodb::db<unsigned long, std::span<const std::byte>>::iterator::prior() [Key = unsigned long, Value = std::span<const std::byte>]"
                     );
      }
      pop(this);
    }
  }
  __assert_fail("node != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art.hpp"
                ,0x454,
                "typename db<Key, Value>::iterator &unodb::db<unsigned long, std::span<const std::byte>>::iterator::prior() [Key = unsigned long, Value = std::span<const std::byte>]"
               );
}

Assistant:

typename db<Key, Value>::iterator& db<Key, Value>::iterator::prior() {
  while (!empty()) {
    const auto& e = top();
    const auto node{e.node};
    UNODB_DETAIL_ASSERT(node != nullptr);
    const auto node_type = node.type();
    if (node_type == node_type::LEAF) {
      pop();     // pop off the leaf
      continue;  // falls through loop if just a root leaf since stack now
                 // empty.
    }
    auto* inode{node.template ptr<inode_type*>()};
    auto nxt = inode->prior(node_type, e.child_index);  // parent's prev child
    if (!nxt) {
      pop();     // Nothing more for that inode.
      continue;  // We will look for the left sibling of the parent inode.
    }
    // Fix up stack for new parent node state and right-most descent.
    UNODB_DETAIL_ASSERT(nxt.has_value());  // value exists for std::optional
    const auto& e2 = nxt.value();
    pop();
    push(e2);
    auto child = inode->get_child(node_type, e2.child_index);  // descend
    return right_most_traversal(child);
  }
  return *this;  // stack is empty, so iterator == end().
}